

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall QPDF::ObjUser::ObjUser(ObjUser *this,user_e type)

{
  user_e type_local;
  ObjUser *this_local;
  
  this->ou_type = type;
  this->pageno = 0;
  std::__cxx11::string::string((string *)&this->key);
  if (type == ou_root) {
    return;
  }
  __assert_fail("type == ou_root",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_optimization.cc"
                ,0xf,"QPDF::ObjUser::ObjUser(user_e)");
}

Assistant:

QPDF::ObjUser::ObjUser(user_e type) :
    ou_type(type)
{
    qpdf_assert_debug(type == ou_root);
}